

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

uint32_t google::protobuf::compiler::cpp::anon_unknown_0::CalcFieldNum
                   (FieldGenerator *generator,FieldDescriptor *field,Options *options)

{
  byte bVar1;
  FieldDescriptor FVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  CType CVar6;
  uint32_t uVar7;
  byte bVar8;
  FieldTypeClass type_class;
  uint uVar9;
  uint type;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  bVar1 = *(byte *)(*(long *)(*(long *)(field + 0x20) + 0x20) + 0x4b);
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_38 = FieldDescriptor::TypeOnceInit;
    local_40 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_38,&local_40);
  }
  FVar2 = field[2];
  uVar9 = (uint)(byte)FVar2;
  if ((FVar2 == (FieldDescriptor)0xc) || (type = uVar9, FVar2 == (FieldDescriptor)0x9)) {
    iVar5 = (*generator->_vptr_FieldGenerator[0x16])(generator);
    type = 0x15;
    if ((char)iVar5 == '\0') {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_38 = FieldDescriptor::TypeOnceInit;
        local_40 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),&local_38,&local_40);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) == 9) {
        CVar6 = EffectiveStringCType(field,options);
        type = 0x13;
        if (CVar6 == FieldOptions_CType_CORD) goto LAB_002a3a48;
      }
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_38 = FieldDescriptor::TypeOnceInit;
        local_40 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),&local_38,&local_40);
      }
      type = uVar9;
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) == 9) &&
         (CVar6 = EffectiveStringCType(field,options), CVar6 == FieldOptions_CType_STRING_PIECE)) {
        type = 0x14;
      }
    }
  }
LAB_002a3a48:
  lVar3 = *(long *)(field + 0x28);
  if ((lVar3 != 0 && ((byte)field[1] & 0x10) != 0) &&
     ((type_class = kOneOf, *(int *)(lVar3 + 4) != 1 ||
      ((*(byte *)(*(long *)(lVar3 + 0x20) + 1) & 2) == 0)))) goto LAB_002a3afe;
  bVar4 = FieldDescriptor::is_packed(field);
  type_class = kPacked;
  if (bVar4) goto LAB_002a3afe;
  FVar2 = field[1];
  bVar8 = (byte)FVar2 & 0x60;
  type_class = kRepeated;
  if (bVar8 == 0x60) goto LAB_002a3afe;
  if (((byte)FVar2 & 2) == 0) {
    if ((bVar8 == 0x20) && (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x02')) {
      if ((((byte)FVar2 & 0x10) == 0) || (*(long *)(field + 0x28) == 0)) goto LAB_002a3ac0;
    }
    else if (bVar8 == 0x40) goto LAB_002a3ac0;
  }
  else {
LAB_002a3ac0:
    type_class = kPresence;
    if (*(char *)(*(long *)(field + 0x38) + 0x4f) != '\x01') goto LAB_002a3afe;
  }
  lVar3 = *(long *)(field + 0x28);
  type_class = kPresence;
  if (lVar3 != 0 && ((byte)FVar2 & 0x10) != 0) {
    if (*(int *)(lVar3 + 4) != 1) goto LAB_002a3afe;
    type_class = (FieldTypeClass)((*(byte *)(*(long *)(lVar3 + 0x20) + 1) & 2) == 0);
  }
  type_class = (FieldTypeClass)(byte)(((byte)type_class | bVar1) ^ 1);
LAB_002a3afe:
  uVar7 = internal::FieldMetadata::CalculateType(type,type_class);
  return uVar7;
}

Assistant:

uint32_t CalcFieldNum(const FieldGenerator& generator,
                      const FieldDescriptor* field, const Options& options) {
  bool is_a_map = IsMapEntryMessage(field->containing_type());
  int type = field->type();
  if (type == FieldDescriptor::TYPE_STRING ||
      type == FieldDescriptor::TYPE_BYTES) {
    // string field
    if (generator.IsInlined()) {
      type = internal::FieldMetadata::kInlinedType;
    } else if (IsCord(field, options)) {
      type = internal::FieldMetadata::kCordType;
    } else if (IsStringPiece(field, options)) {
      type = internal::FieldMetadata::kStringPieceType;
    }
  }

  if (field->real_containing_oneof()) {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kOneOf);
  } else if (field->is_packed()) {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kPacked);
  } else if (field->is_repeated()) {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kRepeated);
  } else if (HasHasbit(field) || field->real_containing_oneof() || is_a_map) {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kPresence);
  } else {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kNoPresence);
  }
}